

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_ObjRemoveDupFanins(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjIsCio(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0xc6,"void Acb_ObjRemoveDupFanins(Acb_Ntk_t *, int)");
  }
  do {
    iVar1 = Acb_ObjRemoveDupFanins_int(p,iObj);
  } while (iVar1 != 0);
  return;
}

Assistant:

void Acb_ObjRemoveDupFanins( Acb_Ntk_t * p, int iObj )
{
    assert( !Acb_ObjIsCio(p, iObj) );
    while ( Acb_ObjRemoveDupFanins_int(p, iObj) );
}